

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreMapping.c
# Opt level: O0

char * XCore_insn_name(csh handle,uint id)

{
  bool bVar1;
  uint i;
  uint id_local;
  csh handle_local;
  
  if (id < 0x79) {
    bVar1 = false;
    while (!bVar1) {
      if (alias_insn_names[0].id == id) {
        return alias_insn_names[0].name;
      }
      bVar1 = true;
    }
    handle_local = (csh)insn_name_maps[id].name;
  }
  else {
    handle_local = 0;
  }
  return (char *)handle_local;
}

Assistant:

const char *XCore_insn_name(csh handle, unsigned int id)
{
#ifndef CAPSTONE_DIET
	unsigned int i;

	if (id >= XCORE_INS_ENDING)
		return NULL;

	// handle special alias first
	for (i = 0; i < ARR_SIZE(alias_insn_names); i++) {
		if (alias_insn_names[i].id == id)
			return alias_insn_names[i].name;
	}

	return insn_name_maps[id].name;
#else
	return NULL;
#endif
}